

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O0

void warnf(Configurable *config,char *fmt,...)

{
  char in_AL;
  ushort **ppuVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  int local_14c;
  undefined1 local_148 [4];
  int cut;
  char print_buffer [256];
  char *ptr;
  undefined4 local_38;
  int len;
  va_list ap;
  char *fmt_local;
  Configurable *config_local;
  
  if (in_AL != '\0') {
    local_1d8 = in_XMM0_Qa;
    local_1c8 = in_XMM1_Qa;
    local_1b8 = in_XMM2_Qa;
    local_1a8 = in_XMM3_Qa;
    local_198 = in_XMM4_Qa;
    local_188 = in_XMM5_Qa;
    local_178 = in_XMM6_Qa;
    local_168 = in_XMM7_Qa;
  }
  if ((config->mute & 1U) == 0) {
    ap[0].overflow_arg_area = local_208;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_38 = 0x10;
    local_1f8 = in_RDX;
    local_1f0 = in_RCX;
    local_1e8 = in_R8;
    local_1e0 = in_R9;
    ptr._4_4_ = curl_mvsnprintf(local_148,0x100,fmt,&local_38);
    print_buffer._248_8_ = local_148;
    while (0 < ptr._4_4_) {
      fputs("Warning: ",(FILE *)config->errors);
      if (ptr._4_4_ < 0x47) {
        fputs((char *)print_buffer._248_8_,(FILE *)config->errors);
        ptr._4_4_ = 0;
      }
      else {
        local_14c = 0x45;
        while (ppuVar1 = __ctype_b_loc(),
              ((*ppuVar1)[(int)(uint)*(byte *)(print_buffer._248_8_ + (long)local_14c)] & 0x2000) ==
              0 && local_14c != 0) {
          local_14c = local_14c + -1;
        }
        if (local_14c == 0) {
          local_14c = 0x45;
        }
        fwrite((void *)print_buffer._248_8_,(long)(local_14c + 1),1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        print_buffer._248_8_ = print_buffer._248_8_ + (long)(local_14c + 1);
        ptr._4_4_ = ptr._4_4_ - local_14c;
      }
    }
  }
  return;
}

Assistant:

void warnf(struct Configurable *config, const char *fmt, ...)
{
  if(!config->mute) {
    va_list ap;
    int len;
    char *ptr;
    char print_buffer[256];

    va_start(ap, fmt);
    len = vsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    va_end(ap);

    ptr = print_buffer;
    while(len > 0) {
      fputs(WARN_PREFIX, config->errors);

      if(len > (int)WARN_TEXTWIDTH) {
        int cut = WARN_TEXTWIDTH-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = WARN_TEXTWIDTH-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut+1; /* skip the space too */
        len -= cut;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
  }
}